

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

String * __thiscall
Rml::Element::GetInnerRML_abi_cxx11_(String *__return_storage_ptr__,Element *this)

{
  Element *this_local;
  String *result;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[8])(this,__return_storage_ptr__)
  ;
  return __return_storage_ptr__;
}

Assistant:

String Element::GetInnerRML() const
{
	String result;
	GetInnerRML(result);
	return result;
}